

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_swift_struct_thrift_extension
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_result,bool is_private)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  reference pptVar5;
  string *psVar6;
  undefined4 extraout_var_00;
  char *local_100;
  string local_e8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c8;
  t_field **local_c0;
  byte local_b1;
  const_iterator cStack_b0;
  bool wrote;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_80;
  allocator local_49;
  string local_48 [8];
  string access;
  bool is_private_local;
  bool is_result_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  access.field_2._M_local_buf[0xe] = is_private;
  access.field_2._M_local_buf[0xf] = is_result;
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"extension ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
  std::operator<<(poVar4," : TStruct");
  block_open(this,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  if ((this->gen_cocoa_ & 1U) == 0) {
    if ((access.field_2._M_local_buf[0xe] & 1U) == 0) {
      local_100 = "public";
    }
    else {
      local_100 = "fileprivate";
      if ((this->gen_cocoa_ & 1U) != 0) {
        local_100 = "private";
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,local_100,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_80);
    poVar4 = std::operator<<(poVar4,local_48);
    std::operator<<(poVar4," static var fieldIds: [String: Int32]");
    std::__cxx11::string::~string((string *)&local_80);
    block_open(this,out);
    t_generator::indent_abi_cxx11_((string *)&fields,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&fields);
    std::operator<<(poVar4,"return [");
    std::__cxx11::string::~string((string *)&fields);
    f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&stack0xffffffffffffff50);
    local_b1 = 0;
    local_c0 = (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    cStack_b0 = (const_iterator)local_c0;
    while( true ) {
      local_c8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff50,&local_c8);
      if (!bVar1) break;
      local_b1 = 1;
      poVar4 = std::operator<<(out,"\"");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff50);
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
      poVar4 = std::operator<<(poVar4,(string *)psVar6);
      poVar4 = std::operator<<(poVar4,"\": ");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff50);
      iVar3 = t_field::get_key(*pptVar5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::operator<<(poVar4,", ");
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&stack0xffffffffffffff50);
    }
    if ((local_b1 & 1) == 0) {
      std::operator<<(out,":");
    }
    poVar4 = std::operator<<(out,"]");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_e8,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_e8);
    poVar4 = std::operator<<(poVar4,local_48);
    poVar4 = std::operator<<(poVar4," static var structName: String { return \"");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
    poVar4 = std::operator<<(poVar4,"\" }");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_e8);
    bVar1 = t_struct::is_union(tstruct);
    if (bVar1) {
      generate_swift_union_reader(this,out,tstruct);
    }
    else {
      generate_swift_struct_reader(this,out,tstruct,(bool)(access.field_2._M_local_buf[0xe] & 1));
    }
    std::__cxx11::string::~string(local_48);
  }
  else {
    generate_swift_struct_reader(this,out,tstruct,(bool)(access.field_2._M_local_buf[0xe] & 1));
    if ((access.field_2._M_local_buf[0xf] & 1U) == 0) {
      generate_old_swift_struct_writer
                (this,out,tstruct,(bool)(access.field_2._M_local_buf[0xe] & 1));
    }
    else {
      generate_old_swift_struct_result_writer(this,out,tstruct);
    }
  }
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_thrift_extension(ostream& out,
                                                               t_struct* tstruct,
                                                               bool is_result,
                                                               bool is_private) {

  indent(out) << "extension " << tstruct->get_name() << " : TStruct";

  block_open(out);

  out << endl;
  if (!gen_cocoa_) {
    /** Swift 3, no writer we just write field ID's */
    string access = (is_private) ? (gen_cocoa_ ? "private" : "fileprivate") : "public";
    // generate fieldID's dictionary
    out << indent() << access << " static var fieldIds: [String: Int32]";
    block_open(out);
    out << indent() << "return [";
    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;
    bool wrote = false;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      wrote = true;
      out << "\"" << (*f_iter)->get_name() << "\": " << (*f_iter)->get_key() << ", ";
    }
    if (!wrote) {
      // pad a colon
      out << ":";
    }
    out << "]" << endl;
    block_close(out);
    out << endl;
    out << indent() << access << " static var structName: String { return \""
        << tstruct->get_name() << "\" }" << endl << endl;

    if (tstruct->is_union()) {
      generate_swift_union_reader(out, tstruct);
    } else {
      generate_swift_struct_reader(out, tstruct, is_private);
    }
  } else {
    /** Legacy Swift2/Cocoa */

    generate_swift_struct_reader(out, tstruct, is_private);

    if (is_result) {
      generate_old_swift_struct_result_writer(out, tstruct);
    }
    else {
      generate_old_swift_struct_writer(out, tstruct, is_private);
    }
  }

  block_close(out);
  out << endl;
}